

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void __thiscall
pybind11::class_<CoreML::MilStoragePython::MilStoragePythonWriter>::class_<>
          (class_<CoreML::MilStoragePython::MilStoragePythonWriter> *this,handle scope,char *name)

{
  bool unused [1];
  undefined1 local_70 [8];
  type_record record;
  char *name_local;
  class_<CoreML::MilStoragePython::MilStoragePythonWriter> *this_local;
  handle scope_local;
  
  record._72_8_ = name;
  detail::generic_type::generic_type(&this->super_generic_type);
  detail::type_record::type_record((type_record *)local_70);
  record.scope.m_ptr = (PyObject *)record._72_8_;
  record.name = " R\x1b";
  record.type = (type_info *)0x8;
  record.type_size = 0x30;
  record.instance_size = (size_t)init_holder;
  record.init_holder = dealloc;
  record.doc._0_1_ = (byte)record.doc | 0x10;
  local_70 = (undefined1  [8])scope.m_ptr;
  detail::process_attributes<>::init((EVP_PKEY_CTX *)local_70);
  detail::generic_type::initialize(&this->super_generic_type,(type_record *)local_70);
  detail::type_record::~type_record((type_record *)local_70);
  return;
}

Assistant:

class_(handle scope, const char *name, const Extra &... extra) {
        detail::type_record record;
        record.scope = scope;
        record.name = name;
        record.type = &typeid(type);
        record.type_size = sizeof(detail::conditional_t<has_alias, type_alias, type>);
        record.instance_size = sizeof(instance_type);
        record.init_holder = init_holder;
        record.dealloc = dealloc;
        record.default_holder = std::is_same<holder_type, std::unique_ptr<type>>::value;

        /* Register base classes specified via template arguments to class_, if any */
        bool unused[] = { (add_base<options>(record), false)..., false };
        (void) unused;

        /* Process optional arguments, if any */
        detail::process_attributes<Extra...>::init(extra..., &record);

        detail::generic_type::initialize(&record);

        if (has_alias) {
            auto &instances = pybind11::detail::get_internals().registered_types_cpp;
            instances[std::type_index(typeid(type_alias))] = instances[std::type_index(typeid(type))];
        }
    }